

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkToBarBufsCollect(Abc_Ntk_t *pNtk)

{
  size_t __size;
  uint uVar1;
  undefined4 uVar2;
  long *plVar3;
  void *pvVar4;
  long *plVar5;
  Vec_Ptr_t *vNodes;
  void **ppvVar6;
  int *__s;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  long lVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int Fill;
  int Fill_00;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x165,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs < 1) {
    __assert_fail("pNtk->nBarBufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x166,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs != pNtk->nObjCounts[8]) {
    __assert_fail("pNtk->nBarBufs == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x167,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  uVar1 = pNtk->nObjs;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar1 - 1) {
    uVar12 = (ulong)uVar1;
  }
  vNodes->nSize = 0;
  iVar14 = (int)uVar12;
  vNodes->nCap = iVar14;
  if (iVar14 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar14 << 3);
  }
  vNodes->pArray = ppvVar6;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar14 = pNtk->vObjs->nSize;
    uVar8 = (long)iVar14 + 500;
    iVar10 = (int)uVar8;
    if ((pNtk->vTravIds).nCap < iVar10) {
      __s = (int *)malloc(uVar8 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar10;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar14) {
      memset(__s,0,(uVar8 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar10;
  }
  iVar14 = pNtk->nTravIds;
  pNtk->nTravIds = iVar14 + 1;
  if (0x3ffffffe < iVar14) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar7 = pNtk->vCis;
  uVar8 = (ulong)(uint)pVVar7->nSize;
  uVar15 = 0;
  if (0 < pVVar7->nSize) {
    do {
      iVar14 = pNtk->nBarBufs;
      if ((long)(int)uVar8 - (long)iVar14 <= (long)uVar15) break;
      plVar3 = (long *)pVVar7->pArray[uVar15];
      iVar10 = (int)uVar12;
      if ((int)uVar15 == iVar10) {
        if (iVar10 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
            iVar14 = extraout_EDX_01;
          }
          else {
            ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
            iVar14 = extraout_EDX;
          }
          vNodes->pArray = ppvVar6;
          vNodes->nCap = 0x10;
          uVar12 = 0x10;
        }
        else {
          uVar12 = (ulong)(uint)(iVar10 * 2);
          if (vNodes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar12 * 8);
            iVar14 = extraout_EDX_02;
          }
          else {
            ppvVar6 = (void **)realloc(vNodes->pArray,uVar12 * 8);
            iVar14 = extraout_EDX_00;
          }
          vNodes->pArray = ppvVar6;
          vNodes->nCap = iVar10 * 2;
        }
      }
      else {
        ppvVar6 = vNodes->pArray;
      }
      vNodes->nSize = (int)uVar15 + 1;
      ppvVar6[uVar15] = plVar3;
      lVar13 = *plVar3;
      iVar10 = (int)plVar3[2];
      uVar2 = *(undefined4 *)(lVar13 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar10 + 1,iVar14);
      if (((long)iVar10 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar10)) goto LAB_0084f0bc;
      *(undefined4 *)(*(long *)(lVar13 + 0xe8) + (long)iVar10 * 4) = uVar2;
      uVar15 = uVar15 + 1;
      pVVar7 = pNtk->vCis;
      uVar8 = (ulong)pVVar7->nSize;
    } while ((long)uVar15 < (long)uVar8);
  }
  iVar14 = (int)uVar15;
  pVVar7 = pNtk->vCos;
  uVar12 = (ulong)(uint)pVVar7->nSize;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      if ((long)(int)uVar12 - (long)pNtk->nBarBufs <= lVar13) {
        plVar3 = (long *)pVVar7->pArray[lVar13];
        Abc_NtkToBarBufsCollect_rec
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8),vNodes)
        ;
        uVar1 = vNodes->nSize;
        uVar11 = vNodes->nCap;
        if (uVar1 == uVar11) {
          if ((int)uVar1 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = 0x10;
            uVar11 = 0x10;
          }
          else {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
            }
            uVar11 = uVar1 * 2;
            vNodes->pArray = ppvVar6;
            vNodes->nCap = uVar11;
          }
        }
        else {
          ppvVar6 = vNodes->pArray;
        }
        vNodes->nSize = uVar1 + 1;
        ppvVar6[(int)uVar1] = plVar3;
        pvVar4 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        if (uVar1 + 1 == uVar11) {
          if ((int)uVar1 < 0xf) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = 0x10;
            uVar11 = 0x10;
          }
          else {
            uVar11 = uVar11 * 2;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar11 * 8);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar11 * 8);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = uVar11;
          }
        }
        else {
          ppvVar6 = vNodes->pArray;
        }
        ppvVar6[(long)(int)uVar1 + 1] = pvVar4;
        plVar5 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        pvVar4 = *(void **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8);
        if (uVar1 + 2 == uVar11) {
          if ((int)uVar1 < 0xe) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = 0x10;
          }
          else {
            __size = (ulong)(uVar11 * 2) * 8;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(__size);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,__size);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = uVar11 * 2;
          }
        }
        else {
          ppvVar6 = vNodes->pArray;
        }
        uVar15 = (ulong)(uVar1 + 3);
        vNodes->nSize = uVar1 + 3;
        ppvVar6[(int)(uVar1 + 2)] = pvVar4;
        lVar9 = *plVar3;
        iVar14 = (int)plVar3[2];
        uVar2 = *(undefined4 *)(lVar9 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar9 + 0xe0),iVar14 + 1,(int)pvVar4);
        if (((long)iVar14 < 0) || (*(int *)(lVar9 + 0xe4) <= iVar14)) goto LAB_0084f0bc;
        *(undefined4 *)(*(long *)(lVar9 + 0xe8) + (long)iVar14 * 4) = uVar2;
        plVar5 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        lVar9 = *plVar5;
        iVar14 = (int)plVar5[2];
        uVar2 = *(undefined4 *)(lVar9 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar9 + 0xe0),iVar14 + 1,Fill);
        if (((long)iVar14 < 0) || (*(int *)(lVar9 + 0xe4) <= iVar14)) goto LAB_0084f0bc;
        *(undefined4 *)(*(long *)(lVar9 + 0xe8) + (long)iVar14 * 4) = uVar2;
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        lVar9 = *plVar3;
        iVar14 = (int)plVar3[2];
        uVar2 = *(undefined4 *)(lVar9 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar9 + 0xe0),iVar14 + 1,Fill_00);
        if (((long)iVar14 < 0) || (*(int *)(lVar9 + 0xe4) <= iVar14)) goto LAB_0084f0bc;
        *(undefined4 *)(*(long *)(lVar9 + 0xe8) + (long)iVar14 * 4) = uVar2;
        pVVar7 = pNtk->vCos;
      }
      iVar14 = (int)uVar15;
      lVar13 = lVar13 + 1;
      iVar10 = pVVar7->nSize;
      uVar12 = (ulong)iVar10;
    } while (lVar13 < (long)uVar12);
    if ((0 < iVar10) && (pNtk->nBarBufs < iVar10)) {
      ppvVar6 = pVVar7->pArray;
      lVar13 = 0;
      do {
        plVar3 = (long *)*ppvVar6;
        Abc_NtkToBarBufsCollect_rec
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8),vNodes)
        ;
        uVar1 = vNodes->nSize;
        if (uVar1 == vNodes->nCap) {
          if ((int)uVar1 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = 0x10;
          }
          else {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = uVar1 * 2;
          }
        }
        else {
          ppvVar6 = vNodes->pArray;
        }
        iVar14 = uVar1 + 1;
        vNodes->nSize = iVar14;
        ppvVar6[(int)uVar1] = plVar3;
        lVar9 = *plVar3;
        iVar10 = (int)plVar3[2];
        uVar2 = *(undefined4 *)(lVar9 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar9 + 0xe0),iVar10 + 1,(int)vNodes);
        if (((long)iVar10 < 0) || (*(int *)(lVar9 + 0xe4) <= iVar10)) {
LAB_0084f0bc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar9 + 0xe8) + (long)iVar10 * 4) = uVar2;
        lVar13 = lVar13 + 1;
        lVar9 = (long)pNtk->vCos->nSize;
      } while ((lVar13 < lVar9) &&
              (ppvVar6 = pNtk->vCos->pArray + lVar13, lVar13 < lVar9 - pNtk->nBarBufs));
    }
  }
  if (iVar14 != pNtk->nObjs) {
    __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkObjNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x185,"Vec_Ptr_t *Abc_NtkToBarBufsCollect(Abc_Ntk_t *)");
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkToBarBufsCollect( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtk->nBarBufs > 0 );
    assert( pNtk->nBarBufs == Abc_NtkLatchNum(pNtk) );
    vNodes = Vec_PtrAlloc( Abc_NtkObjNum(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        Vec_PtrPush( vNodes, pObj );
        Abc_NodeSetTravIdCurrent( pObj );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( i < Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            continue;
        Abc_NtkToBarBufsCollect_rec( Abc_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(pObj) );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(Abc_ObjFanout0(pObj)) );
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pObj) );
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(Abc_ObjFanout0(pObj)) );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Abc_NtkToBarBufsCollect_rec( Abc_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        Abc_NodeSetTravIdCurrent( pObj );
    }
    assert( Vec_PtrSize(vNodes) == Abc_NtkObjNum(pNtk) );
    return vNodes;
}